

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceMultipleComponentsOfInterfaceVarWith
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *interface_var_users,
          vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
          *components,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices,
          uint32_t *extra_array_index,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_composites,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_for_access_chain_to_composites)

{
  iterator __position;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  uint32_t depth_to_component;
  pointer puVar4;
  bool bVar5;
  uint local_c0;
  uint local_bc;
  uint32_t *local_b8;
  Instruction *local_b0;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_a8;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  loads_for_access_chain_to_component_values;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  loads_to_component_values;
  
  local_c0 = 0;
  bVar5 = (components->
          super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
          )._M_impl.super__Vector_impl_data._M_finish ==
          (components->
          super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (!bVar5) {
    local_bc = (uint)(extra_array_index != (uint32_t *)0x0);
    uVar2 = 0;
    local_b8 = extra_array_index;
    local_b0 = interface_var;
    local_a8 = interface_var_users;
    do {
      __position._M_current =
           (interface_var_component_indices->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (interface_var_component_indices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   interface_var_component_indices,__position,&local_c0);
      }
      else {
        *__position._M_current = (uint)uVar2;
        (interface_var_component_indices->
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      loads_to_component_values._M_h._M_buckets = &loads_to_component_values._M_h._M_single_bucket;
      loads_to_component_values._M_h._M_bucket_count = 1;
      loads_to_component_values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      loads_to_component_values._M_h._M_element_count = 0;
      loads_to_component_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      loads_to_component_values._M_h._M_rehash_policy._M_next_resize = 0;
      loads_to_component_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
      loads_for_access_chain_to_component_values._M_h._M_buckets =
           &loads_for_access_chain_to_component_values._M_h._M_single_bucket;
      loads_for_access_chain_to_component_values._M_h._M_bucket_count = 1;
      loads_for_access_chain_to_component_values._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)0x0;
      loads_for_access_chain_to_component_values._M_h._M_element_count = 0;
      loads_for_access_chain_to_component_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      loads_for_access_chain_to_component_values._M_h._M_rehash_policy._M_next_resize = 0;
      loads_for_access_chain_to_component_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
      bVar1 = ReplaceComponentsOfInterfaceVarWith
                        (this,local_b0,local_a8,
                         (components->
                         super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_c0,
                         interface_var_component_indices,local_b8,
                         (unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                          *)&loads_to_component_values._M_h,
                         (unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                          *)&loads_for_access_chain_to_component_values._M_h);
      if (!bVar1) {
        std::
        _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&loads_for_access_chain_to_component_values._M_h);
        std::
        _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&loads_to_component_values._M_h);
        return bVar5;
      }
      puVar4 = (interface_var_component_indices->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1;
      (interface_var_component_indices->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
      depth_to_component =
           (uint32_t)
           ((ulong)((long)puVar4 -
                   (long)(interface_var_component_indices->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
      AddComponentsToCompositesForLoads
                (this,(unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                       *)&loads_for_access_chain_to_component_values._M_h,
                 loads_for_access_chain_to_composites,depth_to_component);
      AddComponentsToCompositesForLoads
                (this,(unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                       *)&loads_to_component_values._M_h,loads_to_composites,
                 depth_to_component + local_bc);
      std::
      _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&loads_for_access_chain_to_component_values._M_h);
      std::
      _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&loads_to_component_values._M_h);
      local_c0 = local_c0 + 1;
      uVar2 = (ulong)local_c0;
      uVar3 = (long)(components->
                    super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(components->
                    super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5;
      bVar5 = uVar3 <= uVar2;
    } while (uVar2 < uVar3);
  }
  return bVar5;
}

Assistant:

bool InterfaceVariableScalarReplacement::
    ReplaceMultipleComponentsOfInterfaceVarWith(
        Instruction* interface_var,
        const std::vector<Instruction*>& interface_var_users,
        const std::vector<NestedCompositeComponents>& components,
        std::vector<uint32_t>& interface_var_component_indices,
        const uint32_t* extra_array_index,
        std::unordered_map<Instruction*, Instruction*>* loads_to_composites,
        std::unordered_map<Instruction*, Instruction*>*
            loads_for_access_chain_to_composites) {
  for (uint32_t i = 0; i < components.size(); ++i) {
    interface_var_component_indices.push_back(i);
    std::unordered_map<Instruction*, Instruction*> loads_to_component_values;
    std::unordered_map<Instruction*, Instruction*>
        loads_for_access_chain_to_component_values;
    if (!ReplaceComponentsOfInterfaceVarWith(
            interface_var, interface_var_users, components[i],
            interface_var_component_indices, extra_array_index,
            &loads_to_component_values,
            &loads_for_access_chain_to_component_values)) {
      return false;
    }
    interface_var_component_indices.pop_back();

    uint32_t depth_to_component =
        static_cast<uint32_t>(interface_var_component_indices.size());
    AddComponentsToCompositesForLoads(
        loads_for_access_chain_to_component_values,
        loads_for_access_chain_to_composites, depth_to_component);
    if (extra_array_index) ++depth_to_component;
    AddComponentsToCompositesForLoads(loads_to_component_values,
                                      loads_to_composites, depth_to_component);
  }
  return true;
}